

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O1

int Sbd_ManCutIsTopo_rec(Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if ((iObj < 0) || (vMirrors->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar6 = (uint)vMirrors->pArray[(uint)iObj] >> 1;
  if (vMirrors->pArray[(uint)iObj] < 0) {
    uVar6 = iObj;
  }
  uVar4 = 1;
  if (uVar6 != 0) {
    if (p->nTravIdsAlloc <= (int)uVar6) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[uVar6] != p->nTravIds) {
      p->pTravIds[uVar6] = p->nTravIds;
      if (((int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      uVar5 = (uint)*(undefined8 *)(pGVar1 + uVar6);
      uVar4 = 0;
      if ((~uVar5 & 0x9fffffff) != 0) {
        if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut2.c"
                        ,0x8e,"int Sbd_ManCutIsTopo_rec(Gia_Man_t *, Vec_Int_t *, int)");
        }
        iVar2 = Sbd_ManCutIsTopo_rec(p,vMirrors,uVar6 - (uVar5 & 0x1fffffff));
        iVar3 = Sbd_ManCutIsTopo_rec
                          (p,vMirrors,uVar6 - (*(uint *)&pGVar1[uVar6].field_0x4 & 0x1fffffff));
        uVar4 = (uint)(iVar3 != 0 && iVar2 != 0);
      }
    }
  }
  return uVar4;
}

Assistant:

int Sbd_ManCutIsTopo_rec( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj )
{
    Gia_Obj_t * pObj; 
    int Ret0, Ret1;
    if ( Vec_IntEntry(vMirrors, iObj) >= 0 )
        iObj = Abc_Lit2Var(Vec_IntEntry(vMirrors, iObj));
    if ( !iObj || Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 1;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    Ret0 = Sbd_ManCutIsTopo_rec( p, vMirrors, Gia_ObjFaninId0(pObj, iObj) );
    Ret1 = Sbd_ManCutIsTopo_rec( p, vMirrors, Gia_ObjFaninId1(pObj, iObj) );
    return Ret0 && Ret1;
}